

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_transform.h
# Opt level: O2

triplet<unsigned_short> __thiscall
charls::transform_hp3<unsigned_short>::inverse::operator()(inverse *this,int v1,int v2,int v3)

{
  int iVar1;
  
  iVar1 = v1 - (v3 + v2 >> 2);
  return (triplet<unsigned_short>)
         ((uint6)((iVar1 + v3 + 0x4000U ^ 0x8000) & 0xffff) |
         (uint6)(uint)((iVar1 + 0x4000) * 0x10000) |
         (uint6)(iVar1 + v2 + 0x4000U ^ 0xffff8000) << 0x20);
}

Assistant:

operator()(const int v1, const int v2, const int v3) const noexcept
        {
            const int g = static_cast<int>(v1 - ((v3 + v2) >> 2) + range_ / 4);
            triplet<T> rgb;
            rgb.R = static_cast<T>(v3 + g - range_ / 2); // new R
            rgb.G = static_cast<T>(g);                   // new G
            rgb.B = static_cast<T>(v2 + g - range_ / 2); // new B
            return rgb;
        }